

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::torrent_log_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_log_alert *this)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(&bStack_58,&local_38,": ");
  __rhs = log_message(this);
  std::operator+(__return_storage_ptr__,&bStack_58,__rhs);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_log_alert::message() const
	{
		return torrent_alert::message() + ": " + log_message();
	}